

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::VariableDatum::VariableDatum
          (VariableDatum *this,DatumID ID,KOCTET *data,KUINT32 sizeInBits)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__VariableDatum_0021fdd0;
  (this->m_v8DatumValue).
  super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_v8DatumValue).
  super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_v8DatumValue).
  super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_ui32DatumID = ID;
  SetDatumValue(this,data,sizeInBits);
  return;
}

Assistant:

VariableDatum::VariableDatum( DatumID ID, const KOCTET* data, KUINT32 sizeInBits )
{
    m_ui32DatumID = ID;

    SetDatumValue( data, sizeInBits );
}